

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O3

bool rcg::setBoolean(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,bool value,
                    bool exception)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  invalid_argument *piVar4;
  long *plVar5;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  
  peVar1 = (nodemap->super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  GenICam_3_4::gcstring::gcstring((gcstring *)&local_80,name);
  iVar2 = (*(peVar1->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>).
            super_CGeneric_XMLLoaderParams._vptr_CGeneric_XMLLoaderParams[7])(peVar1,&local_80);
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  GenICam_3_4::gcstring::~gcstring((gcstring *)&local_80);
  if (plVar3 == (long *)0x0) {
    if (exception) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"Feature not found: ","");
      plVar3 = (long *)std::__cxx11::string::append((char *)local_a0);
      local_80 = (long *)*plVar3;
      plVar5 = plVar3 + 2;
      if (local_80 == plVar5) {
        local_70 = *plVar5;
        lStack_68 = plVar3[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *plVar5;
      }
      local_78 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar4,(string *)&local_80);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    iVar2 = (*(code *)**(undefined8 **)((long)plVar3 + *(long *)(*plVar3 + -0x28)))
                      ((long)plVar3 + *(long *)(*plVar3 + -0x28));
    if ((iVar2 == 4) || (iVar2 == 2)) {
      plVar3 = (long *)__dynamic_cast(plVar3,&GenApi_3_4::INode::typeinfo,
                                      &GenApi_3_4::IBoolean::typeinfo,0xfffffffffffffffe);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0x38))(plVar3,value,1);
        return true;
      }
      if (exception) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_a0[0] = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_a0,"Feature not boolean: ","");
        plVar3 = (long *)std::__cxx11::string::append((char *)local_a0);
        local_80 = (long *)*plVar3;
        plVar5 = plVar3 + 2;
        if (local_80 == plVar5) {
          local_70 = *plVar5;
          lStack_68 = plVar3[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *plVar5;
        }
        local_78 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::invalid_argument::invalid_argument(piVar4,(string *)&local_80);
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
    }
    else if (exception) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_a0[0] = local_90;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a0,"Feature not writable: ","");
      plVar3 = (long *)std::__cxx11::string::append((char *)local_a0);
      local_80 = (long *)*plVar3;
      plVar5 = plVar3 + 2;
      if (local_80 == plVar5) {
        local_70 = *plVar5;
        lStack_68 = plVar3[3];
        local_80 = &local_70;
      }
      else {
        local_70 = *plVar5;
      }
      local_78 = plVar3[1];
      *plVar3 = (long)plVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar4,(string *)&local_80);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  return false;
}

Assistant:

bool setBoolean(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                bool value, bool exception)
{
  bool ret=false;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsWritable(node))
      {
        GenApi::IBoolean *val=dynamic_cast<GenApi::IBoolean *>(node);

        if (val != 0)
        {
          val->SetValue(value);
          ret=true;
        }
        else if (exception)
        {
          throw std::invalid_argument(std::string("Feature not boolean: ")+name);
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not writable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}